

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipp.h
# Opt level: O2

void __thiscall
clipp::detail::
formatting_ostream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
::wrap_soft(formatting_ostream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *this,int times)

{
  ostream *poVar1;
  undefined1 *local_38 [2];
  undefined1 local_28 [16];
  
  if (0 < times) {
    poVar1 = (ostream *)this->os_;
    if (times == 1) {
      std::operator<<(poVar1,'\n');
    }
    else {
      local_38[0] = local_28;
      std::__cxx11::string::_M_construct((ulong)local_38,(char)times);
      std::operator<<(poVar1,(string *)local_38);
      std::__cxx11::string::~string((string *)local_38);
    }
    this->curCol_ = 0;
    this->curParagraphLines_ = this->curParagraphLines_ + 1;
  }
  return;
}

Assistant:

void wrap_soft(int times = 1) {
        if(times < 1) return;
        if(times > 1) {
            os_ << string_type(size_type(times), '\n');
        } else {
            os_ << '\n';
        }
        curCol_ = 0;
        ++curParagraphLines_;
    }